

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.cc
# Opt level: O0

void __thiscall
iqxmlrpc::http::Request_header::Request_header
          (Request_header *this,string *req_uri,string *vhost,int port)

{
  ostream *poVar1;
  allocator<char> local_241;
  string local_240;
  allocator<char> local_219;
  string local_218;
  string local_1f8;
  allocator<char> local_1d1;
  string local_1d0;
  ostringstream local_1b0 [8];
  ostringstream host_opt;
  int port_local;
  string *vhost_local;
  string *req_uri_local;
  Request_header *this_local;
  
  Header::Header(&this->super_Header,HTTP_CHECK_WEAK);
  (this->super_Header)._vptr_Header = (_func_int **)&PTR__Request_header_002528a8;
  std::__cxx11::string::string((string *)&this->uri_,(string *)req_uri);
  std::__cxx11::ostringstream::ostringstream(local_1b0);
  poVar1 = std::operator<<((ostream *)local_1b0,(string *)vhost);
  poVar1 = std::operator<<(poVar1,":");
  std::ostream::operator<<(poVar1,port);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d0,"host",&local_1d1);
  std::__cxx11::ostringstream::str();
  Header::set_option(&this->super_Header,&local_1d0,&local_1f8);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::allocator<char>::~allocator(&local_1d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_218,"user-agent",&local_219);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_240,"Libiqxmlrpc 0.13.6",&local_241);
  Header::set_option(&this->super_Header,&local_218,&local_240);
  std::__cxx11::string::~string((string *)&local_240);
  std::allocator<char>::~allocator(&local_241);
  std::__cxx11::string::~string((string *)&local_218);
  std::allocator<char>::~allocator(&local_219);
  std::__cxx11::ostringstream::~ostringstream(local_1b0);
  return;
}

Assistant:

Request_header::Request_header(
  const std::string& req_uri,
  const std::string& vhost,
  int port
):
  uri_(req_uri)
{
  std::ostringstream host_opt;
  host_opt << vhost << ":" << port;
  set_option(names::host, host_opt.str());
  set_option(names::user_agent, PACKAGE " " VERSION);
}